

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void DecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  BrotliBitReader *pBVar6;
  uint uVar7;
  BrotliDecoderStateInternal *s_local;
  BrotliBitReaderState memento;
  uint32_t block_type;
  uint32_t *ringbuffer;
  BrotliBitReader *br;
  HuffmanCode *len_tree;
  HuffmanCode *type_tree;
  uint32_t max_block_type;
  uint32_t nbits_5;
  uint32_t bits;
  uint32_t index;
  uint32_t val_2;
  uint32_t val_1;
  uint32_t nbits_3;
  uint32_t nbits_4;
  uint32_t nbits;
  HuffmanCode *local_1a0;
  uint32_t nbits_1;
  uint32_t code;
  uint32_t nbits_2;
  HuffmanCode *local_138;
  uint32_t val;
  
  uVar3 = s->num_block_types[1];
  local_1a0 = s->block_type_trees;
  local_138 = s->block_len_trees;
  pBVar6 = &s->br;
  if (0x1f < (s->br).bit_pos_) {
    pBVar6->val_ = pBVar6->val_ >> 0x20;
    (s->br).bit_pos_ = (s->br).bit_pos_ ^ 0x20;
    pBVar6->val_ = (ulong)*(uint *)(s->br).next_in << 0x20 | pBVar6->val_;
    (s->br).avail_in = (s->br).avail_in - 4;
    (s->br).next_in = (s->br).next_in + 4;
  }
  uVar5 = (uint)(pBVar6->val_ >> ((byte)(s->br).bit_pos_ & 0x3f));
  local_1a0 = local_1a0 + (ulong)(uVar5 & 0xff) + 0x278;
  if (8 < local_1a0->bits) {
    bVar1 = local_1a0->bits;
    (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
    local_1a0 = local_1a0 +
                (long)(int)(uint)local_1a0->value + (ulong)(uVar5 >> 8 & kBitMask[bVar1 - 8]);
  }
  (s->br).bit_pos_ = (uint)local_1a0->bits + (s->br).bit_pos_;
  uVar5 = (uint)local_1a0->value;
  if (0x1f < (s->br).bit_pos_) {
    pBVar6->val_ = pBVar6->val_ >> 0x20;
    (s->br).bit_pos_ = (s->br).bit_pos_ ^ 0x20;
    pBVar6->val_ = (ulong)*(uint *)(s->br).next_in << 0x20 | pBVar6->val_;
    (s->br).avail_in = (s->br).avail_in - 4;
    (s->br).next_in = (s->br).next_in + 4;
  }
  uVar7 = (uint)(pBVar6->val_ >> ((byte)(s->br).bit_pos_ & 0x3f));
  local_138 = local_138 + (ulong)(uVar7 & 0xff) + 0x18c;
  if (8 < local_138->bits) {
    bVar1 = local_138->bits;
    (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
    local_138 = local_138 +
                (long)(int)(uint)local_138->value + (ulong)(uVar7 >> 8 & kBitMask[bVar1 - 8]);
  }
  (s->br).bit_pos_ = (uint)local_138->bits + (s->br).bit_pos_;
  bVar1 = kBlockLengthPrefixCode[(uint)local_138->value].nbits;
  uVar2 = kBlockLengthPrefixCode[(uint)local_138->value].offset;
  if (0x1f < (s->br).bit_pos_) {
    pBVar6->val_ = pBVar6->val_ >> 0x20;
    (s->br).bit_pos_ = (s->br).bit_pos_ ^ 0x20;
    pBVar6->val_ = (ulong)*(uint *)(s->br).next_in << 0x20 | pBVar6->val_;
    (s->br).avail_in = (s->br).avail_in - 4;
    (s->br).next_in = (s->br).next_in + 4;
  }
  uVar4 = (s->br).bit_pos_;
  uVar7 = kBitMask[(uint)bVar1];
  (s->br).bit_pos_ = (uint)bVar1 + (s->br).bit_pos_;
  s->block_length[1] = (uint)uVar2 + ((uint)(pBVar6->val_ >> ((byte)uVar4 & 0x3f)) & uVar7);
  if (uVar5 == 1) {
    memento.avail_in._4_4_ = s->block_type_rb[3] + 1;
  }
  else if (uVar5 == 0) {
    memento.avail_in._4_4_ = s->block_type_rb[2];
  }
  else {
    memento.avail_in._4_4_ = uVar5 - 2;
  }
  if (uVar3 <= memento.avail_in._4_4_) {
    memento.avail_in._4_4_ = memento.avail_in._4_4_ - uVar3;
  }
  s->block_type_rb[2] = s->block_type_rb[3];
  s->block_type_rb[3] = memento.avail_in._4_4_;
  s->htree_command = (s->insert_copy_hgroup).htrees[s->block_type_rb[3]];
  return;
}

Assistant:

static void BROTLI_NOINLINE DecodeCommandBlockSwitch(BrotliDecoderState* s) {
  DecodeCommandBlockSwitchInternal(0, s);
}